

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O3

bool __thiscall Assimp::STLImporter::LoadBinaryFile(STLImporter *this)

{
  aiColor4D *paVar1;
  size_t __n;
  aiColor4D **__s;
  float fVar2;
  undefined8 uVar3;
  ushort uVar4;
  undefined4 uVar5;
  aiNode *paVar6;
  undefined4 uVar8;
  aiScene *paVar7;
  uint uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ushort uVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  bool bVar18;
  aiMesh **ppaVar19;
  aiMesh *pMesh;
  long lVar20;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  aiColor4D *paVar21;
  aiNode *this_00;
  aiNode **ppaVar22;
  uint *puVar23;
  ulong uVar24;
  Logger *pLVar25;
  runtime_error *prVar26;
  ushort uVar27;
  uint i;
  ulong uVar28;
  char *pcVar29;
  uint i_1;
  uint uVar30;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  aiColor4D *local_48;
  aiColor4D *local_40;
  size_t local_38;
  
  this->pScene->mNumMeshes = 1;
  ppaVar19 = (aiMesh **)operator_new__(8);
  this->pScene->mMeshes = ppaVar19;
  pMesh = (aiMesh *)operator_new(0x520);
  pMesh->mPrimitiveTypes = 0;
  pMesh->mNumVertices = 0;
  pMesh->mNumFaces = 0;
  memset(&pMesh->mVertices,0,0xcc);
  pMesh->mBones = (aiBone **)0x0;
  pMesh->mMaterialIndex = 0;
  (pMesh->mName).length = 0;
  (pMesh->mName).data[0] = '\0';
  memset((pMesh->mName).data + 1,0x1b,0x3ff);
  pMesh->mNumAnimMeshes = 0;
  pMesh->mAnimMeshes = (aiAnimMesh **)0x0;
  pMesh->mMethod = 0;
  (pMesh->mAABB).mMin.x = 0.0;
  (pMesh->mAABB).mMin.y = 0.0;
  (pMesh->mAABB).mMin.z = 0.0;
  (pMesh->mAABB).mMax.x = 0.0;
  (pMesh->mAABB).mMax.y = 0.0;
  (pMesh->mAABB).mMax.z = 0.0;
  __s = pMesh->mColors;
  memset(__s,0,0xa0);
  *this->pScene->mMeshes = pMesh;
  if (this->fileSize < 0x54) {
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"STL: file is too small for the header","");
    std::runtime_error::runtime_error(prVar26,(string *)local_68);
    *(undefined ***)prVar26 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar29 = this->mBuffer;
  lVar20 = 0;
  do {
    if (pcVar29[lVar20] == 'C') {
      if (pcVar29[lVar20 + 1] == 'O') {
        if (pcVar29[lVar20 + 2] == 'L') {
          if (pcVar29[lVar20 + 3] == 'O') {
            if (pcVar29[lVar20 + 4] == 'R') {
              lVar17 = lVar20 + 6;
              if (pcVar29[lVar20 + 5] == '=') {
                pLVar25 = DefaultLogger::get();
                Logger::info(pLVar25,"STL: Taking code path for Materialise files");
                (this->clrColorDefault).r = (float)(byte)pcVar29[lVar20 + 6] * 0.003921569;
                (this->clrColorDefault).g = (float)(byte)pcVar29[lVar20 + 7] * 0.003921569;
                (this->clrColorDefault).b = (float)(byte)pcVar29[lVar20 + 8] * 0.003921569;
                (this->clrColorDefault).a = (float)(byte)pcVar29[lVar20 + 9] * 0.003921569;
                pcVar29 = this->mBuffer;
                bVar18 = true;
                goto LAB_0060dbb5;
              }
            }
            else {
              lVar17 = lVar20 + 5;
            }
          }
          else {
            lVar17 = lVar20 + 4;
          }
        }
        else {
          lVar17 = lVar20 + 3;
        }
      }
      else {
        lVar17 = lVar20 + 2;
      }
    }
    else {
      lVar17 = lVar20 + 1;
    }
    lVar20 = lVar17;
  } while (lVar20 < 0x50);
  bVar18 = false;
LAB_0060dbb5:
  paVar6 = this->pScene->mRootNode;
  (paVar6->mName).length = 0xc;
  builtin_strncpy((paVar6->mName).data,"<STL_BINARY>",0xd);
  uVar30 = *(uint *)(pcVar29 + 0x50);
  pMesh->mNumFaces = uVar30;
  if (this->fileSize < uVar30 * 0x32 + 0x54) {
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"STL: file is too small to hold all facets","");
    std::runtime_error::runtime_error(prVar26,(string *)local_68);
    *(undefined ***)prVar26 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar30 != 0) {
    pcVar29 = pcVar29 + 0x54;
    uVar9 = uVar30 * 3;
    pMesh->mNumVertices = uVar9;
    uVar24 = (ulong)uVar9 * 0xc;
    __s_00 = (aiVector3D *)operator_new__(uVar24);
    __n = (((ulong)uVar9 * 0xc - 0xc) / 0xc) * 0xc + 0xc;
    uVar28 = 0;
    memset(__s_00,0,__n);
    pMesh->mVertices = __s_00;
    __s_01 = (aiVector3D *)operator_new__(uVar24);
    memset(__s_01,0,__n);
    pMesh->mNormals = __s_01;
    local_48 = &this->clrColorDefault;
    do {
      fVar2 = *(float *)(pcVar29 + 8);
      uVar3 = *(undefined8 *)pcVar29;
      __s_01->x = (float)(int)uVar3;
      __s_01->y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_01->z = fVar2;
      uVar5 = __s_01->x;
      uVar8 = __s_01->y;
      __s_01[1].x = (float)uVar5;
      __s_01[1].y = (float)uVar8;
      fVar2 = __s_01->z;
      __s_01[1].z = fVar2;
      __s_01[2].x = (float)uVar5;
      __s_01[2].y = (float)uVar8;
      __s_01[2].z = fVar2;
      fVar2 = *(float *)(pcVar29 + 0x14);
      uVar3 = *(undefined8 *)(pcVar29 + 0xc);
      __s_00->x = (float)(int)uVar3;
      __s_00->y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_00->z = fVar2;
      fVar2 = *(float *)(pcVar29 + 0x20);
      uVar3 = *(undefined8 *)(pcVar29 + 0x18);
      __s_00[1].x = (float)(int)uVar3;
      __s_00[1].y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_00[1].z = fVar2;
      fVar2 = *(float *)(pcVar29 + 0x2c);
      uVar3 = *(undefined8 *)(pcVar29 + 0x24);
      __s_00[2].x = (float)(int)uVar3;
      __s_00[2].y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_00[2].z = fVar2;
      uVar4 = *(ushort *)(pcVar29 + 0x30);
      if ((short)uVar4 < 0) {
        paVar21 = *__s;
        if (paVar21 == (aiColor4D *)0x0) {
          uVar30 = pMesh->mNumVertices;
          local_38 = (ulong)uVar30 << 4;
          paVar21 = (aiColor4D *)operator_new__(local_38);
          if ((ulong)uVar30 == 0) {
            *__s = paVar21;
            uVar24 = 0;
          }
          else {
            uVar30 = 0;
            local_40 = paVar21;
            memset(paVar21,0,local_38);
            *__s = local_40;
            do {
              paVar21 = pMesh->mColors[0];
              pMesh->mColors[0] = paVar21 + 1;
              fVar2 = local_48->g;
              fVar15 = local_48->b;
              fVar16 = local_48->a;
              paVar21->r = local_48->r;
              paVar21->g = fVar2;
              paVar21->b = fVar15;
              paVar21->a = fVar16;
              uVar30 = uVar30 + 1;
              uVar24 = (ulong)pMesh->mNumVertices;
            } while (uVar30 < pMesh->mNumVertices);
            paVar21 = *__s;
          }
          *__s = paVar21 + -uVar24;
          pLVar25 = DefaultLogger::get();
          Logger::info(pLVar25,"STL: Mesh has vertex colors");
          paVar21 = *__s;
        }
        uVar24 = (ulong)(uint)((int)uVar28 * 3);
        uVar27 = uVar4 >> 10;
        uVar14 = uVar4;
        if (!bVar18) {
          uVar27 = uVar4;
          uVar14 = uVar4 >> 10;
        }
        paVar21[uVar24].a = 1.0;
        paVar21[uVar24].r = (float)(uVar14 & 0x31) * 0.032258064;
        paVar21[uVar24].g = (float)(uVar4 >> 5 & 0x31) * 0.032258064;
        paVar21[uVar24].b = (float)(uVar27 & 0x31) * 0.032258064;
        paVar1 = paVar21 + uVar24;
        uVar10 = paVar1->r;
        uVar11 = paVar1->g;
        uVar12 = paVar1->b;
        uVar13 = paVar1->a;
        paVar1 = paVar21 + uVar24 + 1;
        paVar1->r = (float)uVar10;
        paVar1->g = (float)uVar11;
        paVar1->b = (float)uVar12;
        paVar1->a = (float)uVar13;
        paVar21 = paVar21 + uVar24 + 2;
        paVar21->r = (float)uVar10;
        paVar21->g = (float)uVar11;
        paVar21->b = (float)uVar12;
        paVar21->a = (float)uVar13;
        uVar30 = pMesh->mNumFaces;
      }
      __s_01 = __s_01 + 3;
      __s_00 = __s_00 + 3;
      pcVar29 = pcVar29 + 0x32;
      uVar28 = uVar28 + 1;
    } while (uVar28 < uVar30);
    addFacesToMesh(pMesh);
    paVar6 = this->pScene->mRootNode;
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    this_00->mParent = paVar6;
    paVar6->mNumChildren = 1;
    ppaVar22 = (aiNode **)operator_new__(8);
    paVar6->mChildren = ppaVar22;
    *ppaVar22 = this_00;
    paVar7 = this->pScene;
    uVar30 = paVar7->mNumMeshes;
    this_00->mNumMeshes = uVar30;
    puVar23 = (uint *)operator_new__((ulong)uVar30 << 2);
    this_00->mMeshes = puVar23;
    if (paVar7->mNumMeshes != 0) {
      uVar24 = 0;
      do {
        this_00->mMeshes[uVar24] = (uint)uVar24;
        uVar24 = uVar24 + 1;
      } while (uVar24 < this->pScene->mNumMeshes);
    }
    if ((bVar18) && (*__s == (aiColor4D *)0x0)) {
      bVar18 = true;
    }
    else {
      bVar18 = false;
    }
    return bVar18;
  }
  prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"STL: file is empty. There are no facets defined","");
  std::runtime_error::runtime_error(prVar26,(string *)local_68);
  *(undefined ***)prVar26 = &PTR__runtime_error_00875f28;
  __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool STLImporter::LoadBinaryFile()
{
    // allocate one mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pMesh = pScene->mMeshes[0] = new aiMesh();
    pMesh->mMaterialIndex = 0;

    // skip the first 80 bytes
    if (fileSize < 84) {
        throw DeadlyImportError("STL: file is too small for the header");
    }
    bool bIsMaterialise = false;

    // search for an occurrence of "COLOR=" in the header
    const unsigned char* sz2 = (const unsigned char*)mBuffer;
    const unsigned char* const szEnd = sz2+80;
    while (sz2 < szEnd) {

        if ('C' == *sz2++ && 'O' == *sz2++ && 'L' == *sz2++ &&
            'O' == *sz2++ && 'R' == *sz2++ && '=' == *sz2++)    {

            // read the default vertex color for facets
            bIsMaterialise = true;
            ASSIMP_LOG_INFO("STL: Taking code path for Materialise files");
            const ai_real invByte = (ai_real)1.0 / ( ai_real )255.0;
            clrColorDefault.r = (*sz2++) * invByte;
            clrColorDefault.g = (*sz2++) * invByte;
            clrColorDefault.b = (*sz2++) * invByte;
            clrColorDefault.a = (*sz2++) * invByte;
            break;
        }
    }
    const unsigned char* sz = (const unsigned char*)mBuffer + 80;

    // now read the number of facets
    pScene->mRootNode->mName.Set("<STL_BINARY>");

    pMesh->mNumFaces = *((uint32_t*)sz);
    sz += 4;

    if (fileSize < 84 + pMesh->mNumFaces*50) {
        throw DeadlyImportError("STL: file is too small to hold all facets");
    }

    if (!pMesh->mNumFaces) {
        throw DeadlyImportError("STL: file is empty. There are no facets defined");
    }

    pMesh->mNumVertices = pMesh->mNumFaces*3;

    
    aiVector3D *vp = pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
    aiVector3D *vn = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    typedef aiVector3t<float> aiVector3F;
    aiVector3F* theVec;
    aiVector3F theVec3F;
    
    for ( unsigned int i = 0; i < pMesh->mNumFaces; ++i ) {
        // NOTE: Blender sometimes writes empty normals ... this is not
        // our fault ... the RemoveInvalidData helper step should fix that

        // There's one normal for the face in the STL; use it three times
        // for vertex normals
        theVec = (aiVector3F*) sz;
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vn->x = theVec3F.x; vn->y = theVec3F.y; vn->z = theVec3F.z;
        *(vn+1) = *vn;
        *(vn+2) = *vn;
        ++theVec;
        vn += 3;

        // vertex 1
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 2
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 3
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;
        
        sz = (const unsigned char*) theVec;

        uint16_t color = *((uint16_t*)sz);
        sz += 2;

        if (color & (1 << 15))
        {
            // seems we need to take the color
            if (!pMesh->mColors[0])
            {
                pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
                for (unsigned int i = 0; i <pMesh->mNumVertices;++i)
                    *pMesh->mColors[0]++ = this->clrColorDefault;
                pMesh->mColors[0] -= pMesh->mNumVertices;

                ASSIMP_LOG_INFO("STL: Mesh has vertex colors");
            }
            aiColor4D* clr = &pMesh->mColors[0][i*3];
            clr->a = 1.0;
            const ai_real invVal( (ai_real)1.0 / ( ai_real )31.0 );
            if (bIsMaterialise) // this is reversed
            {
                clr->r = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->b = ((color & (0x31u<<10))>>10u) *invVal;
            }
            else
            {
                clr->b = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->r = ((color & (0x31u<<10))>>10u) *invVal;
            }
            // assign the color to all vertices of the face
            *(clr+1) = *clr;
            *(clr+2) = *clr;
        }
    }

    // now copy faces
    addFacesToMesh(pMesh);

    aiNode* root = pScene->mRootNode;

    // allocate one node
    aiNode* node = new aiNode();
    node->mParent = root;

    root->mNumChildren = 1u;
    root->mChildren = new aiNode*[root->mNumChildren];
    root->mChildren[0] = node;

    // add all created meshes to the single node
    node->mNumMeshes = pScene->mNumMeshes;
    node->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; i++)
        node->mMeshes[i] = i;

    if (bIsMaterialise && !pMesh->mColors[0])
    {
        // use the color as diffuse material color
        return true;
    }
    return false;
}